

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

void Dch_ClassesPrepare(Dch_Cla_t *p,int fLatchCorr,int nMaxLevs)

{
  Aig_Obj_t *pRepr_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *__ptr;
  Aig_Obj_t **ppNexts_00;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  int local_64;
  int local_60;
  int nEntries2;
  int nEntries;
  int iEntry;
  int nNodes;
  int nTableSize;
  int k;
  int i;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pObj;
  Aig_Obj_t **ppClassNew;
  Aig_Obj_t **ppNexts;
  Aig_Obj_t **ppTable;
  int nMaxLevs_local;
  int fLatchCorr_local;
  Dch_Cla_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p->pAig);
  uVar2 = Abc_PrimeCudd(iVar1 / 4);
  __ptr = calloc((long)(int)uVar2,8);
  iVar1 = Aig_ManObjNumMax(p->pAig);
  ppNexts_00 = (Aig_Obj_t **)calloc((long)iVar1,8);
  local_60 = 0;
  nTableSize = 0;
  do {
    iVar1 = Vec_PtrSize(p->pAig->vObjs);
    if (iVar1 <= nTableSize) {
      ppAVar6 = (Aig_Obj_t **)malloc((long)(local_60 + p->nCands1) << 3);
      p->pMemClasses = ppAVar6;
      p->pMemClassesFree = p->pMemClasses + local_60;
      local_64 = 0;
      nTableSize = 0;
      do {
        iVar1 = Vec_PtrSize(p->pAig->vObjs);
        if (iVar1 <= nTableSize) {
          if (local_60 == local_64) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            if (ppNexts_00 != (Aig_Obj_t **)0x0) {
              free(ppNexts_00);
            }
            Dch_ClassesRefine(p);
            Dch_ClassesCheck(p);
            return;
          }
          __assert_fail("nEntries == nEntries2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                        ,0x1a8,"void Dch_ClassesPrepare(Dch_Cla_t *, int, int)");
        }
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,nTableSize);
        if ((pAVar4 != (Aig_Obj_t *)0x0) &&
           (((iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0 || (iVar1 = Aig_ObjIsCi(pAVar4), iVar1 != 0)
             ) && (iVar1 = p->pClassSizes[pAVar4->Id], iVar1 != 0)))) {
          if (iVar1 < 2) {
            __assert_fail("nNodes > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                          ,0x199,"void Dch_ClassesPrepare(Dch_Cla_t *, int, int)");
          }
          ppAVar6 = p->pMemClasses + local_64;
          *ppAVar6 = pAVar4;
          pRepr = Dch_ObjNext(ppNexts_00,pAVar4);
          nNodes = 1;
          while (pRepr != (Aig_Obj_t *)0x0) {
            ppAVar6[iVar1 - nNodes] = pRepr;
            pRepr = Dch_ObjNext(ppNexts_00,pRepr);
            nNodes = nNodes + 1;
          }
          p->pClassSizes[pAVar4->Id] = 0;
          Dch_ObjAddClass(p,pAVar4,ppAVar6,iVar1);
          local_64 = iVar1 + local_64;
        }
        nTableSize = nTableSize + 1;
      } while( true );
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,nTableSize);
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      if (fLatchCorr == 0) {
        iVar1 = Aig_ObjIsNode(pAVar4);
        if (((iVar1 != 0) || (iVar1 = Aig_ObjIsCi(pAVar4), iVar1 != 0)) &&
           ((nMaxLevs == 0 ||
            ((int)((uint)((ulong)*(undefined8 *)&pAVar4->field_0x18 >> 0x20) & 0xffffff) < nMaxLevs)
            ))) goto LAB_007731c8;
      }
      else {
        iVar1 = Aig_ObjIsCi(pAVar4);
        if (iVar1 != 0) {
LAB_007731c8:
          iVar1 = (*p->pFuncNodeIsConst)(p->pManData,pAVar4);
          if (iVar1 == 0) {
            uVar3 = (*p->pFuncNodeHash)(p->pManData,pAVar4);
            uVar3 = uVar3 % uVar2;
            if (*(long *)((long)__ptr + (long)(int)uVar3 * 8) == 0) {
              *(Aig_Obj_t **)((long)__ptr + (long)(int)uVar3 * 8) = pAVar4;
            }
            else {
              pRepr_00 = *(Aig_Obj_t **)((long)__ptr + (long)(int)uVar3 * 8);
              Aig_ObjSetRepr(p->pAig,pAVar4,pRepr_00);
              pAVar5 = Dch_ObjNext(ppNexts_00,pRepr_00);
              if (pAVar5 == (Aig_Obj_t *)0x0) {
                p->pClassSizes[pRepr_00->Id] = p->pClassSizes[pRepr_00->Id] + 1;
                local_60 = local_60 + 1;
              }
              pAVar5 = Dch_ObjNext(ppNexts_00,pRepr_00);
              Dch_ObjSetNext(ppNexts_00,pAVar4,pAVar5);
              Dch_ObjSetNext(ppNexts_00,pRepr_00,pAVar4);
              p->pClassSizes[pRepr_00->Id] = p->pClassSizes[pRepr_00->Id] + 1;
              local_60 = local_60 + 1;
            }
          }
          else {
            Dch_ObjSetConst1Cand(p->pAig,pAVar4);
            p->nCands1 = p->nCands1 + 1;
          }
        }
      }
    }
    nTableSize = nTableSize + 1;
  } while( true );
}

Assistant:

void Dch_ClassesPrepare( Dch_Cla_t * p, int fLatchCorr, int nMaxLevs )
{
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppClassNew;
    Aig_Obj_t * pObj, * pTemp, * pRepr;
    int i, k, nTableSize, nNodes, iEntry, nEntries, nEntries2;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNumMax(p->pAig)/4 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize ); 
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) ); 

    // add all the nodes to the hash table
    nEntries = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level >= nMaxLevs )
                continue;
        }
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( p->pManData, pObj ) )
        {
            Dch_ObjSetConst1Cand( p->pAig, pObj );
            p->nCands1++;
            continue;
        }
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( p->pManData, pObj ) % nTableSize;
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
            ppTable[iEntry] = pObj;
        else
        {
            // set the representative of this node
            pRepr = ppTable[iEntry];
            Aig_ObjSetRepr( p->pAig, pObj, pRepr );
            // add node to the table
            if ( Dch_ObjNext( ppNexts, pRepr ) == NULL )
            { // this will be the second entry
                p->pClassSizes[pRepr->Id]++;
                nEntries++;
            }
            // add the entry to the list
            Dch_ObjSetNext( ppNexts, pObj, Dch_ObjNext( ppNexts, pRepr ) );
            Dch_ObjSetNext( ppNexts, pRepr, pObj );
            p->pClassSizes[pRepr->Id]++;
            nEntries++;
        }
    }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, nEntries + p->nCands1 );
    p->pMemClassesFree = p->pMemClasses + nEntries;
 
    // copy the entries into storage in the topological order
    nEntries2 = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        nNodes = p->pClassSizes[pObj->Id];
        // skip the nodes that are not representatives of non-trivial classes
        if ( nNodes == 0 )
            continue;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        ppClassNew = p->pMemClasses + nEntries2;
        ppClassNew[0] = pObj;
        for ( pTemp = Dch_ObjNext(ppNexts, pObj), k = 1; pTemp; 
              pTemp = Dch_ObjNext(ppNexts, pTemp), k++ )
        {
            ppClassNew[nNodes-k] = pTemp;
        }
        // add the class of nodes
        p->pClassSizes[pObj->Id] = 0;
        Dch_ObjAddClass( p, pObj, ppClassNew, nNodes );
        // increment the number of entries
        nEntries2 += nNodes;
    }
    assert( nEntries == nEntries2 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    Dch_ClassesRefine( p );
    Dch_ClassesCheck( p );
}